

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mem.cpp
# Opt level: O0

void * crnlib::crnlib_malloc(size_t size,size_t *pActual_size)

{
  uint8 *p_new;
  size_t actual_size;
  size_t *pActual_size_local;
  size_t size_local;
  
  pActual_size_local = (size_t *)(size + 3 & 0xfffffffffffffffc);
  if (pActual_size_local == (size_t *)0x0) {
    pActual_size_local = (size_t *)0x4;
  }
  actual_size = (size_t)pActual_size;
  if (pActual_size_local < (size_t *)0x400000001) {
    p_new = (uint8 *)pActual_size_local;
    size_local = (*(code *)g_pRealloc)(0,pActual_size_local,&p_new,1,g_pUser_data);
    if (actual_size != 0) {
      *(uint8 **)actual_size = p_new;
    }
    if ((size_local == 0) || (p_new < pActual_size_local)) {
      crnlib_mem_error("crnlib_malloc: out of memory");
      size_local = 0;
    }
  }
  else {
    crnlib_mem_error("crnlib_malloc: size too big");
    size_local = 0;
  }
  return (void *)size_local;
}

Assistant:

void* crnlib_malloc(size_t size, size_t* pActual_size) {
  size = (size + sizeof(uint32) - 1U) & ~(sizeof(uint32) - 1U);
  if (!size)
    size = sizeof(uint32);

  if (size > CRNLIB_MAX_POSSIBLE_BLOCK_SIZE) {
    crnlib_mem_error("crnlib_malloc: size too big");
    return NULL;
  }

  size_t actual_size = size;
  uint8* p_new = static_cast<uint8*>((*g_pRealloc)(NULL, size, &actual_size, true, g_pUser_data));

  if (pActual_size)
    *pActual_size = actual_size;

  if ((!p_new) || (actual_size < size)) {
    crnlib_mem_error("crnlib_malloc: out of memory");
    return NULL;
  }

  CRNLIB_ASSERT((reinterpret_cast<ptr_bits_t>(p_new) & (CRNLIB_MIN_ALLOC_ALIGNMENT - 1)) == 0);

#if CRNLIB_MEM_STATS
  CRNLIB_ASSERT((*g_pMSize)(p_new, g_pUser_data) == actual_size);
  update_total_allocated(1, static_cast<mem_stat_t>(actual_size));
#endif

  return p_new;
}